

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.h
# Opt level: O0

bool __thiscall RingBuffer<8192,_unsigned_int>::Read(RingBuffer<8192,_unsigned_int> *this,uint *val)

{
  int local_34;
  int r;
  uint *val_local;
  RingBuffer<8192,_unsigned_int> *this_local;
  
  local_34 = this->readpos;
  if (local_34 == this->writepos) {
    this_local._7_1_ = false;
  }
  else {
    if (local_34 == 0x1fff) {
      local_34 = 0;
    }
    else {
      local_34 = local_34 + 1;
    }
    *val = this->buffer[local_34];
    this->readpos = local_34;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool Read(T& val)
    {
        int r = readpos;
        if (r == writepos)
            return false;
        r = (r == LENGTH - 1) ? 0 : (r + 1);
        val = buffer[r];
        readpos = r;
        return true;
    }